

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# module.cpp
# Opt level: O3

bool __thiscall
LLVMBC::ModuleParseContext::parse_constants_block(ModuleParseContext *this,BlockOrRecord *entry)

{
  pointer pBVar1;
  bool bVar2;
  BlockOrRecord *child;
  pointer entry_00;
  
  this->constant_type = (Type *)0x0;
  entry_00 = (entry->children).
             super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
             ._M_impl.super__Vector_impl_data._M_start;
  pBVar1 = (entry->children).
           super__Vector_base<LLVMBC::BlockOrRecord,_dxil_spv::ThreadLocalAllocator<LLVMBC::BlockOrRecord>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (entry_00 == pBVar1) {
    bVar2 = true;
  }
  else {
    do {
      bVar2 = parse_constants_record(this,entry_00);
      if (!bVar2) {
        return bVar2;
      }
      entry_00 = entry_00 + 1;
    } while (entry_00 != pBVar1);
  }
  return bVar2;
}

Assistant:

bool ModuleParseContext::parse_constants_block(const BlockOrRecord &entry)
{
	constant_type = nullptr;
	for (auto &child : entry.children)
		if (!parse_constants_record(child))
			return false;
	return true;
}